

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeMemSetStr(Mem *pMem,char *z,int n,u8 enc,_func_void_void_ptr *xDel)

{
  byte *pbVar1;
  char cVar2;
  char cVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  u8 uVar9;
  sqlite3 *psVar10;
  char *__dest;
  int iVar11;
  u16 uVar12;
  uint uVar13;
  ulong uVar14;
  
  if (z == (char *)0x0) {
    if ((pMem->flags & 0x2460) == 0) {
      pMem->flags = 1;
    }
    else {
      vdbeMemClearExternAndSetNull(pMem);
    }
    iVar7 = 0;
  }
  else {
    psVar10 = pMem->db;
    if (psVar10 == (sqlite3 *)0x0) {
      iVar11 = 1000000000;
    }
    else {
      iVar11 = psVar10->aLimit[0];
    }
    uVar13 = 2;
    if (enc == '\0') {
      uVar13 = 0x10;
    }
    if (n < 0) {
      if (enc == '\x01') {
        sVar8 = strlen(z);
        uVar5 = (uint)sVar8 & 0x3fffffff;
        uVar4 = iVar11 + 1;
        if ((int)uVar5 <= iVar11) {
          uVar4 = uVar5;
        }
        uVar14 = (ulong)uVar4;
      }
      else {
        uVar14 = 0;
        if (-1 < iVar11) {
          do {
            if (z[uVar14 + 1] == '\0' && z[uVar14] == '\0') break;
            uVar14 = uVar14 + 2;
          } while ((int)uVar14 <= iVar11);
        }
      }
      n = (int)uVar14;
      uVar13 = uVar13 | 0x200;
    }
    uVar12 = (u16)uVar13;
    if (xDel == (_func_void_void_ptr *)0xffffffffffffffff) {
      iVar7 = 0;
      if (uVar13 >> 9 != 0) {
        iVar7 = (enc != '\x01') + 1;
      }
      if (iVar11 < n) {
        return 0x12;
      }
      iVar7 = iVar7 + n;
      iVar6 = 0x20;
      if (0x20 < iVar7) {
        iVar6 = iVar7;
      }
      if (pMem->szMalloc < iVar6) {
        iVar6 = sqlite3VdbeMemGrow(pMem,iVar6,0);
        if (iVar6 != 0) {
          return 7;
        }
        __dest = pMem->z;
      }
      else {
        __dest = pMem->zMalloc;
        pMem->z = __dest;
        pMem->flags = pMem->flags & 0xd;
      }
      memcpy(__dest,z,(long)iVar7);
    }
    else if (xDel == sqlite3MallocSize) {
      if (((pMem->flags & 0x2460) != 0) || (pMem->szMalloc != 0)) {
        vdbeMemClear(pMem);
        psVar10 = pMem->db;
      }
      pMem->z = z;
      pMem->zMalloc = z;
      if (((psVar10 == (sqlite3 *)0x0) || (z < (psVar10->lookaside).pStart)) ||
         ((psVar10->lookaside).pEnd <= z)) {
        uVar13 = (*sqlite3Config.m.xSize)(z);
      }
      else {
        uVar13 = (uint)(psVar10->lookaside).sz;
      }
      pMem->szMalloc = uVar13;
    }
    else {
      if (((pMem->flags & 0x2460) != 0) || (pMem->szMalloc != 0)) {
        vdbeMemClear(pMem);
      }
      pMem->z = z;
      pMem->xDel = xDel;
      uVar12 = (ushort)(xDel == (_func_void_void_ptr *)0x0) * 0x400 + uVar12 + 0x400;
    }
    pMem->n = n;
    pMem->flags = uVar12;
    uVar9 = '\x01';
    if (1 < enc) {
      uVar9 = enc;
    }
    pMem->enc = uVar9;
    if ((1 < enc) && (1 < n)) {
      cVar2 = *pMem->z;
      cVar3 = pMem->z[1];
      uVar9 = '\x02';
      if ((cVar3 == -2 && cVar2 == -1) || (uVar9 = '\x03', cVar3 == -1 && cVar2 == -2)) {
        iVar7 = sqlite3VdbeMemMakeWriteable(pMem);
        if (iVar7 != 0) {
          return 7;
        }
        sVar8 = (long)pMem->n - 2;
        pMem->n = (int)sVar8;
        memmove(pMem->z,pMem->z + 2,sVar8);
        pMem->z[pMem->n] = '\0';
        pMem->z[(long)pMem->n + 1] = '\0';
        pbVar1 = (byte *)((long)&pMem->flags + 1);
        *pbVar1 = *pbVar1 | 2;
        pMem->enc = uVar9;
      }
    }
    iVar7 = 0x12;
    if (n <= iVar11) {
      iVar7 = 0;
    }
  }
  return iVar7;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemSetStr(
  Mem *pMem,          /* Memory cell to set to string value */
  const char *z,      /* String pointer */
  int n,              /* Bytes in string, or negative */
  u8 enc,             /* Encoding of z.  0 for BLOBs */
  void (*xDel)(void*) /* Destructor function */
){
  int nByte = n;      /* New value for pMem->n */
  int iLimit;         /* Maximum allowed string or blob size */
  u16 flags = 0;      /* New value for pMem->flags */

  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( (pMem->flags & MEM_RowSet)==0 );

  /* If z is a NULL pointer, set pMem to contain an SQL NULL. */
  if( !z ){
    sqlite3VdbeMemSetNull(pMem);
    return SQLITE_OK;
  }

  if( pMem->db ){
    iLimit = pMem->db->aLimit[SQLITE_LIMIT_LENGTH];
  }else{
    iLimit = SQLITE_MAX_LENGTH;
  }
  flags = (enc==0?MEM_Blob:MEM_Str);
  if( nByte<0 ){
    assert( enc!=0 );
    if( enc==SQLITE_UTF8 ){
      nByte = sqlite3Strlen30(z);
      if( nByte>iLimit ) nByte = iLimit+1;
    }else{
      for(nByte=0; nByte<=iLimit && (z[nByte] | z[nByte+1]); nByte+=2){}
    }
    flags |= MEM_Term;
  }

  /* The following block sets the new values of Mem.z and Mem.xDel. It
  ** also sets a flag in local variable "flags" to indicate the memory
  ** management (one of MEM_Dyn or MEM_Static).
  */
  if( xDel==SQLITE_TRANSIENT ){
    int nAlloc = nByte;
    if( flags&MEM_Term ){
      nAlloc += (enc==SQLITE_UTF8?1:2);
    }
    if( nByte>iLimit ){
      return SQLITE_TOOBIG;
    }
    testcase( nAlloc==0 );
    testcase( nAlloc==31 );
    testcase( nAlloc==32 );
    if( sqlite3VdbeMemClearAndResize(pMem, MAX(nAlloc,32)) ){
      return SQLITE_NOMEM_BKPT;
    }
    memcpy(pMem->z, z, nAlloc);
  }else if( xDel==SQLITE_DYNAMIC ){
    sqlite3VdbeMemRelease(pMem);
    pMem->zMalloc = pMem->z = (char *)z;
    pMem->szMalloc = sqlite3DbMallocSize(pMem->db, pMem->zMalloc);
  }else{
    sqlite3VdbeMemRelease(pMem);
    pMem->z = (char *)z;
    pMem->xDel = xDel;
    flags |= ((xDel==SQLITE_STATIC)?MEM_Static:MEM_Dyn);
  }

  pMem->n = nByte;
  pMem->flags = flags;
  pMem->enc = (enc==0 ? SQLITE_UTF8 : enc);

#ifndef SQLITE_OMIT_UTF16
  if( pMem->enc!=SQLITE_UTF8 && sqlite3VdbeMemHandleBom(pMem) ){
    return SQLITE_NOMEM_BKPT;
  }
#endif

  if( nByte>iLimit ){
    return SQLITE_TOOBIG;
  }

  return SQLITE_OK;
}